

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::updateArea(btSoftBody *this,bool averageArea)

{
  float fVar1;
  uint uVar2;
  Face *pFVar3;
  Node *pNVar4;
  Node *pNVar5;
  ulong uVar6;
  btScalar *pbVar7;
  ulong uVar8;
  Node **ppNVar9;
  int j_1;
  int j;
  ulong uVar10;
  long lVar11;
  btScalar bVar12;
  int local_4c;
  btAlignedObjectArray<int> counts;
  
  uVar2 = (this->m_faces).m_size;
  uVar10 = 0;
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar10;
  }
  for (; uVar6 * 0x48 - uVar10 != 0; uVar10 = uVar10 + 0x48) {
    pFVar3 = (this->m_faces).m_data;
    bVar12 = AreaOf((btVector3 *)(*(long *)((long)pFVar3->m_n + uVar10) + 0x10),
                    (btVector3 *)(*(long *)((long)pFVar3->m_n + uVar10 + 8) + 0x10),
                    (btVector3 *)(*(long *)((long)pFVar3->m_n + uVar10 + 0x10) + 0x10));
    *(btScalar *)((long)(&pFVar3->m_normal + 1) + uVar10) = bVar12;
  }
  if (averageArea) {
    counts.m_ownsMemory = true;
    counts.m_data = (int *)0x0;
    counts.m_size = 0;
    counts.m_capacity = 0;
    local_4c = 0;
    btAlignedObjectArray<int>::resize(&counts,(this->m_nodes).m_size,&local_4c);
    uVar2 = (this->m_nodes).m_size;
    pNVar4 = (this->m_nodes).m_data;
    uVar10 = 0;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = uVar10;
    }
    for (; uVar6 * 0x78 - uVar10 != 0; uVar10 = uVar10 + 0x78) {
      *(undefined4 *)((long)(&pNVar4->m_n + 1) + uVar10 + 4) = 0;
    }
    uVar2 = (this->m_faces).m_size;
    pFVar3 = (this->m_faces).m_data;
    pNVar4 = (this->m_nodes).m_data;
    uVar10 = 0;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = uVar10;
    }
    ppNVar9 = pFVar3->m_n;
    for (; uVar10 != uVar6; uVar10 = uVar10 + 1) {
      fVar1 = pFVar3[uVar10].m_ra;
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        pNVar5 = ppNVar9[lVar11];
        counts.m_data[(int)(((long)pNVar5 - (long)pNVar4) / 0x78)] =
             counts.m_data[(int)(((long)pNVar5 - (long)pNVar4) / 0x78)] + 1;
        pNVar5->m_area = pNVar5->m_area + ABS(fVar1);
      }
      ppNVar9 = ppNVar9 + 9;
    }
    uVar2 = (this->m_nodes).m_size;
    uVar10 = 0;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = uVar10;
    }
    pbVar7 = &((this->m_nodes).m_data)->m_area;
    for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
      if (counts.m_data[uVar10] < 1) {
        *pbVar7 = 0.0;
      }
      else {
        *pbVar7 = *pbVar7 / (float)counts.m_data[uVar10];
      }
      pbVar7 = pbVar7 + 0x1e;
    }
    btAlignedObjectArray<int>::~btAlignedObjectArray(&counts);
  }
  else {
    uVar2 = (this->m_nodes).m_size;
    pNVar4 = (this->m_nodes).m_data;
    uVar10 = 0;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = uVar10;
    }
    for (; uVar6 * 0x78 - uVar10 != 0; uVar10 = uVar10 + 0x78) {
      *(undefined4 *)((long)(&pNVar4->m_n + 1) + uVar10 + 4) = 0;
    }
    uVar2 = (this->m_faces).m_size;
    pFVar3 = (this->m_faces).m_data;
    uVar8 = 0;
    uVar10 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar10 = uVar8;
    }
    ppNVar9 = pFVar3->m_n;
    for (; uVar8 != uVar10; uVar8 = uVar8 + 1) {
      fVar1 = pFVar3[uVar8].m_ra;
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        ppNVar9[lVar11]->m_area = ppNVar9[lVar11]->m_area + fVar1;
      }
      ppNVar9 = ppNVar9 + 9;
    }
    pNVar4 = (this->m_nodes).m_data;
    for (lVar11 = 0; uVar6 * 0x78 - lVar11 != 0; lVar11 = lVar11 + 0x78) {
      *(float *)((long)(&pNVar4->m_n + 1) + lVar11 + 4) =
           *(float *)((long)(&pNVar4->m_n + 1) + lVar11 + 4) * 0.3333333;
    }
  }
  return;
}

Assistant:

void				btSoftBody::updateArea(bool averageArea)
{
	int i,ni;

	/* Face area		*/ 
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
		Face&		f=m_faces[i];
		f.m_ra	=	AreaOf(f.m_n[0]->m_x,f.m_n[1]->m_x,f.m_n[2]->m_x);
	}
	
	/* Node area		*/ 

	if (averageArea)
	{
		btAlignedObjectArray<int>	counts;
		counts.resize(m_nodes.size(),0);
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			m_nodes[i].m_area	=	0;
		}
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			btSoftBody::Face&	f=m_faces[i];
			for(int j=0;j<3;++j)
			{
				const int index=(int)(f.m_n[j]-&m_nodes[0]);
				counts[index]++;
				f.m_n[j]->m_area+=btFabs(f.m_ra);
			}
		}
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			if(counts[i]>0)
				m_nodes[i].m_area/=(btScalar)counts[i];
			else
				m_nodes[i].m_area=0;
		}
	}
	else
	{
		// initialize node area as zero
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			m_nodes[i].m_area=0;	
		}

		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			btSoftBody::Face&	f=m_faces[i];

			for(int j=0;j<3;++j)
			{
				f.m_n[j]->m_area += f.m_ra;
			}
		}

		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			m_nodes[i].m_area *= 0.3333333f;
		}
	}
}